

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPCompoundPacketBuilder::AddBYEPacket
          (RTCPCompoundPacketBuilder *this,uint32_t *ssrcs,uint8_t numssrcs,void *reasondata,
          uint8_t reasonlength)

{
  size_t *psVar1;
  uint8_t *puVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  RTPMemoryManager *pRVar6;
  int iVar7;
  _List_node_base *p_Var8;
  size_t sVar9;
  size_t sVar10;
  undefined4 extraout_var;
  _List_node_base *p_Var11;
  ulong uVar12;
  _List_node_base *p_Var13;
  ushort uVar14;
  size_t local_48;
  
  iVar7 = -0x2a;
  if ((this->arebuilding == true) && (iVar7 = -0x2d, numssrcs < 0x20)) {
    p_Var13 = (_List_node_base *)((ulong)numssrcs * 4 + 4);
    if (reasonlength == '\0') {
      local_48 = 0;
      p_Var8 = p_Var13;
    }
    else {
      uVar12 = (ulong)(reasonlength + 1 & 3);
      local_48 = 4 - uVar12;
      if (uVar12 == 0) {
        local_48 = 0;
      }
      p_Var8 = (_List_node_base *)((long)&p_Var13->_M_next + local_48 + (uint)reasonlength + 1);
    }
    sVar4 = this->appsize;
    sVar5 = this->byesize;
    sVar9 = SDES::NeededBytes(&this->sdes);
    sVar10 = Report::NeededBytes(&this->report);
    iVar7 = -0x2b;
    if ((long)&p_Var8->_M_next + sVar10 + sVar9 + sVar5 + sVar4 <= this->maximumpacketsize) {
      pRVar6 = (this->super_RTCPCompoundPacket).super_RTPMemoryObject.mgr;
      if (pRVar6 == (RTPMemoryManager *)0x0) {
        p_Var11 = (_List_node_base *)operator_new__((ulong)p_Var8);
      }
      else {
        iVar7 = (*pRVar6->_vptr_RTPMemoryManager[2])(pRVar6,p_Var8,4);
        p_Var11 = (_List_node_base *)CONCAT44(extraout_var,iVar7);
      }
      if (p_Var11 == (_List_node_base *)0x0) {
        iVar7 = -1;
      }
      else {
        uVar14 = (short)((ulong)p_Var8 >> 2) - 1;
        *(byte *)&p_Var11->_M_next = numssrcs | 0x80;
        *(ushort *)((long)&p_Var11->_M_next + 2) = uVar14 * 0x100 | uVar14 >> 8;
        *(undefined1 *)((long)&p_Var11->_M_next + 1) = 0xcb;
        if (numssrcs != '\0') {
          uVar12 = 0;
          do {
            uVar3 = ssrcs[uVar12];
            *(uint *)((long)&p_Var11->_M_next + uVar12 * 4 + 4) =
                 uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
            uVar12 = uVar12 + 1;
          } while (numssrcs != uVar12);
        }
        if (reasonlength != '\0') {
          puVar2 = (uint8_t *)((long)&p_Var13->_M_next + (long)&p_Var11->_M_next);
          *puVar2 = reasonlength;
          memcpy(puVar2 + 1,reasondata,(ulong)reasonlength);
          if (local_48 != 0) {
            memset((void *)((long)p_Var11 + ((long)p_Var8 - local_48)),0,local_48);
          }
        }
        p_Var13 = (_List_node_base *)operator_new(0x20);
        p_Var13[1]._M_next = p_Var11;
        p_Var13[1]._M_prev = p_Var8;
        std::__detail::_List_node_base::_M_hook(p_Var13);
        psVar1 = &(this->byepackets).
                  super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        this->byesize = (long)&p_Var8->_M_next + this->byesize;
        iVar7 = 0;
      }
    }
  }
  return iVar7;
}

Assistant:

int RTCPCompoundPacketBuilder::AddBYEPacket(uint32_t *ssrcs,uint8_t numssrcs,const void *reasondata,uint8_t reasonlength)
{
	if (!arebuilding)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTBUILDING;

	if (numssrcs > 31)
		return ERR_RTP_RTCPCOMPPACKBUILDER_TOOMANYSSRCS;
	
	size_t packsize = sizeof(RTCPCommonHeader)+sizeof(uint32_t)*((size_t)numssrcs);
	size_t zerobytes = 0;
	
	if (reasonlength > 0)
	{
		packsize += 1; // 1 byte for the length;
		packsize += (size_t)reasonlength;

		size_t r = (packsize&0x03);
		if (r != 0)
		{
			zerobytes = 4-r;
			packsize += zerobytes;
		}
	}

#ifndef RTP_SUPPORT_RTCPUNKNOWN
	size_t totalotherbytes = appsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#else
	size_t totalotherbytes = appsize+unknownsize+byesize+sdes.NeededBytes()+report.NeededBytes();
#endif // RTP_SUPPORT_RTCPUNKNOWN 

	if ((totalotherbytes + packsize) > maximumpacketsize)
		return ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT;

	uint8_t *buf;
	size_t numwords;
	
	buf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEPACKET) uint8_t[packsize];
	if (buf == 0)
		return ERR_RTP_OUTOFMEM;

	RTCPCommonHeader *hdr = (RTCPCommonHeader *)buf;

	hdr->version = 2;
	hdr->padding = 0;
	hdr->count = numssrcs;
	
	numwords = packsize/sizeof(uint32_t);
	hdr->length = htons((uint16_t)(numwords-1));
	hdr->packettype = RTP_RTCPTYPE_BYE;
	
	uint32_t *sources = (uint32_t *)(buf+sizeof(RTCPCommonHeader));
	uint8_t srcindex;
	
	for (srcindex = 0 ; srcindex < numssrcs ; srcindex++)
		sources[srcindex] = htonl(ssrcs[srcindex]);

	if (reasonlength != 0)
	{
		size_t offset = sizeof(RTCPCommonHeader)+((size_t)numssrcs)*sizeof(uint32_t);

		buf[offset] = reasonlength;
		memcpy((buf+offset+1),reasondata,(size_t)reasonlength);
		for (size_t i = 0 ; i < zerobytes ; i++)
			buf[packsize-1-i] = 0;
	}

	byepackets.push_back(Buffer(buf,packsize));
	byesize += packsize;
	
	return 0;
}